

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_buf.cpp
# Opt level: O0

int __thiscall OutputBuffer::write2buf(OutputBuffer *this,char *data,int len)

{
  Mempool *pMVar1;
  Chunk *pCVar2;
  EVP_PKEY_CTX *src;
  Chunk *new_buf;
  int len_local;
  char *data_local;
  OutputBuffer *this_local;
  
  if ((this->super_BufferBase).data_buf == (Chunk *)0x0) {
    pMVar1 = Mempool::get_instance();
    pCVar2 = Mempool::alloc_chunk(pMVar1,len);
    (this->super_BufferBase).data_buf = pCVar2;
    if ((this->super_BufferBase).data_buf == (Chunk *)0x0) {
      if (1 < pr_level) {
        printf("[%-5s][%s:%d] no free buf for alloc\n","info","write2buf",0x6d);
      }
      return -1;
    }
  }
  else {
    if (((this->super_BufferBase).data_buf)->head != 0) {
      __assert_fail("data_buf->head == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/data_buf.cpp"
                    ,0x72,"int OutputBuffer::write2buf(const char *, int)");
    }
    if (((this->super_BufferBase).data_buf)->capacity - ((this->super_BufferBase).data_buf)->length
        < len) {
      pMVar1 = Mempool::get_instance();
      pCVar2 = Mempool::alloc_chunk(pMVar1,len + ((this->super_BufferBase).data_buf)->length);
      if (pCVar2 == (Chunk *)0x0) {
        if (1 < pr_level) {
          printf("[%-5s][%s:%d] no free buf for alloc\n","info","write2buf",0x76);
        }
        return -1;
      }
      Chunk::copy(pCVar2,(EVP_PKEY_CTX *)(this->super_BufferBase).data_buf,src);
      pMVar1 = Mempool::get_instance();
      Mempool::retrieve(pMVar1,(this->super_BufferBase).data_buf);
      (this->super_BufferBase).data_buf = pCVar2;
    }
  }
  memcpy(((this->super_BufferBase).data_buf)->data + ((this->super_BufferBase).data_buf)->length,
         data,(long)len);
  pCVar2 = (this->super_BufferBase).data_buf;
  pCVar2->length = len + pCVar2->length;
  return 0;
}

Assistant:

int OutputBuffer::write2buf(const char *data, int len)
{
    if (data_buf == nullptr) {
        data_buf = Mempool::get_instance().alloc_chunk(len);
        if (data_buf == nullptr) {
            PR_INFO("no free buf for alloc\n");
            return -1;
        }
    }
    else {
        assert(data_buf->head == 0);
        if (data_buf->capacity - data_buf->length < len) {
            Chunk *new_buf = Mempool::get_instance().alloc_chunk(len + data_buf->length);
            if (new_buf == nullptr) {
                PR_INFO("no free buf for alloc\n");
                return -1;
            }
            new_buf->copy(data_buf);
            Mempool::get_instance().retrieve(data_buf);
            data_buf = new_buf;
        }
    }

    memcpy(data_buf->data + data_buf->length, data, len);
    data_buf->length += len;

    return 0;
}